

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

void __thiscall
perfetto::protos::gen::CommitDataRequest::Serialize(CommitDataRequest *this,Message *msg)

{
  pointer pCVar1;
  pointer pCVar2;
  uint8_t *src_begin;
  Message *pMVar3;
  CommitDataRequest_ChunksToMove *it;
  pointer this_00;
  pointer this_01;
  
  pCVar1 = (this->chunks_to_move_).
           super__Vector_base<perfetto::protos::gen::CommitDataRequest_ChunksToMove,_std::allocator<perfetto::protos::gen::CommitDataRequest_ChunksToMove>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (this->chunks_to_move_).
                 super__Vector_base<perfetto::protos::gen::CommitDataRequest_ChunksToMove,_std::allocator<perfetto::protos::gen::CommitDataRequest_ChunksToMove>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != pCVar1; this_00 = this_00 + 1
      ) {
    pMVar3 = protozero::Message::BeginNestedMessageInternal(msg,1);
    CommitDataRequest_ChunksToMove::Serialize(this_00,pMVar3);
  }
  pCVar2 = (this->chunks_to_patch_).
           super__Vector_base<perfetto::protos::gen::CommitDataRequest_ChunkToPatch,_std::allocator<perfetto::protos::gen::CommitDataRequest_ChunkToPatch>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_01 = (this->chunks_to_patch_).
                 super__Vector_base<perfetto::protos::gen::CommitDataRequest_ChunkToPatch,_std::allocator<perfetto::protos::gen::CommitDataRequest_ChunkToPatch>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_01 != pCVar2; this_01 = this_01 + 1
      ) {
    pMVar3 = protozero::Message::BeginNestedMessageInternal(msg,2);
    CommitDataRequest_ChunkToPatch::Serialize(this_01,pMVar3);
  }
  if (((this->_has_field_).super__Base_bitset<1UL>._M_w & 8) != 0) {
    protozero::Message::AppendVarInt<unsigned_long>(msg,3,this->flush_request_id_);
  }
  src_begin = (uint8_t *)(this->unknown_fields_)._M_dataplus._M_p;
  protozero::Message::WriteToStream
            (msg,src_begin,src_begin + (this->unknown_fields_)._M_string_length);
  return;
}

Assistant:

void CommitDataRequest::Serialize(::protozero::Message* msg) const {
  // Field 1: chunks_to_move
  for (auto& it : chunks_to_move_) {
    it.Serialize(msg->BeginNestedMessage<::protozero::Message>(1));
  }

  // Field 2: chunks_to_patch
  for (auto& it : chunks_to_patch_) {
    it.Serialize(msg->BeginNestedMessage<::protozero::Message>(2));
  }

  // Field 3: flush_request_id
  if (_has_field_[3]) {
    msg->AppendVarInt(3, flush_request_id_);
  }

  msg->AppendRawProtoBytes(unknown_fields_.data(), unknown_fields_.size());
}